

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpropertyanimation.cpp
# Opt level: O2

void __thiscall
QPropertyAnimation::setPropertyName(QPropertyAnimation *this,QByteArray *propertyName)

{
  QObjectCompatProperty<QPropertyAnimationPrivate,_QByteArray,_&QPropertyAnimationPrivate::_qt_property_propertyName_offset,_&QPropertyAnimationPrivate::setPropertyName,_nullptr,_nullptr>
  *lhs;
  QPropertyAnimationPrivate *this_00;
  bool bVar1;
  parameter_type pVar2;
  long in_FS_OFFSET;
  QMessageLogger local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QPropertyAnimationPrivate **)(this + 8);
  pVar2 = QObjectBindableProperty<QAbstractAnimationPrivate,_QAbstractAnimation::State,_&QAbstractAnimationPrivate::_qt_property_state_offset,_nullptr>
          ::value(&(this_00->super_QVariantAnimationPrivate).super_QAbstractAnimationPrivate.state);
  if (pVar2 == Stopped) {
    lhs = &this_00->propertyName;
    QObjectCompatProperty<QPropertyAnimationPrivate,_QByteArray,_&QPropertyAnimationPrivate::_qt_property_propertyName_offset,_&QPropertyAnimationPrivate::setPropertyName,_nullptr,_nullptr>
    ::removeBindingUnlessInWrapper(lhs);
    bVar1 = ::operator==((QByteArray *)lhs,propertyName);
    if (!bVar1) {
      QByteArray::operator=((QByteArray *)lhs,propertyName);
      QPropertyAnimationPrivate::updateMetaProperty(this_00);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        QObjectCompatProperty<QPropertyAnimationPrivate,_QByteArray,_&QPropertyAnimationPrivate::_qt_property_propertyName_offset,_&QPropertyAnimationPrivate::setPropertyName,_nullptr,_nullptr>
        ::notify(lhs);
        return;
      }
      goto LAB_00368c20;
    }
  }
  else {
    local_40.context.version = 2;
    local_40.context.function._4_4_ = 0;
    local_40.context._4_8_ = 0;
    local_40.context._12_8_ = 0;
    local_40.context.category = "default";
    QMessageLogger::warning
              (&local_40,
               "QPropertyAnimation::setPropertyName: you can\'t change the property name of a running animation"
              );
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
LAB_00368c20:
  __stack_chk_fail();
}

Assistant:

void QPropertyAnimation::setPropertyName(const QByteArray &propertyName)
{
    Q_D(QPropertyAnimation);
    if (d->state != QAbstractAnimation::Stopped) {
        qWarning("QPropertyAnimation::setPropertyName: you can't change the property name of a running animation");
        return;
    }

    d->propertyName.removeBindingUnlessInWrapper();

    if (d->propertyName.valueBypassingBindings() == propertyName)
        return;

    d->propertyName.setValueBypassingBindings(propertyName);
    d->updateMetaProperty();
    d->propertyName.notify();
}